

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void xy_y_convolve_2tap_4x2_sse2(int16_t *src,__m128i *s_64,__m128i *coeffs,__m128i *r)

{
  __m128i *in_RCX;
  __m128i *in_RDX;
  undefined1 (*in_RSI) [16];
  long in_RDI;
  __m128i alVar1;
  __m128i ss1;
  __m128i ss0;
  __m128i s_128 [2];
  __m128i local_128;
  __m128i local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  __m128i *local_e8;
  __m128i *local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_90 = (undefined8 *)(in_RDI + 8);
  local_a8 = *local_90;
  uStack_a0 = 0;
  *(undefined8 *)in_RSI[1] = local_a8;
  *(undefined8 *)(in_RSI[1] + 8) = 0;
  local_58 = *(undefined8 *)*in_RSI;
  uStack_50 = *(undefined8 *)(*in_RSI + 8);
  local_68 = *(undefined8 *)in_RSI[1];
  uStack_60 = *(undefined8 *)(in_RSI[1] + 8);
  local_108 = vpunpcklqdq_avx(*in_RSI,in_RSI[1]);
  local_b0 = (undefined8 *)(in_RDI + 0x10);
  local_c8 = *local_b0;
  uStack_c0 = 0;
  *(undefined8 *)*in_RSI = local_c8;
  *(undefined8 *)(*in_RSI + 8) = 0;
  local_88 = *(undefined8 *)*in_RSI;
  uStack_80 = *(undefined8 *)(*in_RSI + 8);
  local_78 = *(undefined8 *)in_RSI[1];
  uStack_70 = *(undefined8 *)(in_RSI[1] + 8);
  local_f8 = vpunpcklqdq_avx(in_RSI[1],*in_RSI);
  local_38 = local_108._0_8_;
  uStack_30 = local_108._8_8_;
  local_48 = local_f8._0_8_;
  uStack_40 = local_f8._8_8_;
  local_118 = (__m128i)vpunpcklwd_avx(local_108,local_f8);
  local_18 = local_108._0_8_;
  uStack_10 = local_108._8_8_;
  local_28 = local_f8._0_8_;
  uStack_20 = local_f8._8_8_;
  alVar1 = (__m128i)vpunpckhwd_avx(local_108,local_f8);
  local_128 = alVar1;
  local_e8 = in_RCX;
  local_e0 = in_RDX;
  convolve16_2tap_sse2(&local_118,in_RDX);
  *local_e8 = alVar1;
  convolve16_2tap_sse2(&local_128,local_e0);
  local_e8[1] = alVar1;
  return;
}

Assistant:

static inline void xy_y_convolve_2tap_4x2_sse2(const int16_t *const src,
                                               __m128i s_64[2],
                                               const __m128i coeffs[1],
                                               __m128i r[2]) {
  __m128i s_128[2];

  s_64[1] = _mm_loadl_epi64((__m128i *)(src + 4));
  s_128[0] = _mm_unpacklo_epi64(s_64[0], s_64[1]);
  s_64[0] = _mm_loadl_epi64((__m128i *)(src + 2 * 4));
  s_128[1] = _mm_unpacklo_epi64(s_64[1], s_64[0]);
  const __m128i ss0 = _mm_unpacklo_epi16(s_128[0], s_128[1]);
  const __m128i ss1 = _mm_unpackhi_epi16(s_128[0], s_128[1]);
  r[0] = convolve16_2tap_sse2(&ss0, coeffs);
  r[1] = convolve16_2tap_sse2(&ss1, coeffs);
}